

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_colorf nk_hsva_colorf(float h,float s,float v,float a)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  nk_colorf nVar8;
  
  if (s <= 0.0) {
    uVar3 = CONCAT44(v,v);
  }
  else {
    fVar1 = h / 0.16666667;
    fVar4 = (1.0 - s) * v;
    fVar7 = (1.0 - (1.0 - (fVar1 - (float)(int)fVar1)) * s) * v;
    fVar5 = fVar4;
    fVar2 = v;
    fVar6 = fVar7;
    if ((int)fVar1 - 1U < 5) {
      fVar6 = (1.0 - s * (fVar1 - (float)(int)fVar1)) * v;
      fVar2 = fVar4;
      switch((int)fVar1) {
      case 1:
        fVar2 = fVar6;
        fVar6 = v;
        break;
      case 2:
        fVar5 = fVar7;
        fVar6 = v;
        break;
      case 3:
        fVar5 = v;
        break;
      case 4:
        fVar5 = v;
        fVar2 = fVar7;
        fVar6 = fVar4;
        break;
      case 5:
        fVar5 = fVar6;
        fVar2 = v;
        fVar6 = fVar4;
      }
    }
    uVar3 = CONCAT44(fVar6,fVar2);
    v = fVar5;
  }
  nVar8.a = a;
  nVar8.b = v;
  nVar8.r = (float)(int)uVar3;
  nVar8.g = (float)(int)((ulong)uVar3 >> 0x20);
  return nVar8;
}

Assistant:

NK_API struct nk_colorf
nk_hsva_colorf(float h, float s, float v, float a)
{
int i;
float p, q, t, f;
struct nk_colorf out = {0,0,0,0};
if (s <= 0.0f) {
out.r = v; out.g = v; out.b = v; out.a = a;
return out;
}
h = h / (60.0f/360.0f);
i = (int)h;
f = h - (float)i;
p = v * (1.0f - s);
q = v * (1.0f - (s * f));
t = v * (1.0f - s * (1.0f - f));

switch (i) {
case 0: default: out.r = v; out.g = t; out.b = p; break;
case 1: out.r = q; out.g = v; out.b = p; break;
case 2: out.r = p; out.g = v; out.b = t; break;
case 3: out.r = p; out.g = q; out.b = v; break;
case 4: out.r = t; out.g = p; out.b = v; break;
case 5: out.r = v; out.g = p; out.b = q; break;}
out.a = a;
return out;
}